

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromHexadecimalString
          (IEEEFloat *this,StringRef s,roundingMode rounding_mode)

{
  bool bVar1;
  uint digitValue;
  int iVar2;
  opStatus oVar3;
  iterator pcVar4;
  int local_74;
  int expAdjustment;
  integerPart hex_value;
  iterator firstSignificantDigit;
  iterator p;
  iterator dot;
  iterator end;
  iterator begin;
  uint local_38;
  uint uStack_34;
  bool computedTrailingFraction;
  uint bitPos;
  uint partsCount;
  integerPart *significand;
  lostFraction lost_fraction;
  roundingMode rounding_mode_local;
  IEEEFloat *this_local;
  StringRef s_local;
  
  s_local.Data = (char *)s.Length;
  this_local = (IEEEFloat *)s.Data;
  significand._0_4_ = lfExactlyZero;
  this->field_0x12 = this->field_0x12 & 0xf8 | 2;
  significand._4_4_ = rounding_mode;
  _lost_fraction = this;
  zeroSignificand(this);
  this->exponent = 0;
  _bitPos = significandParts(this);
  uStack_34 = partCount(this);
  local_38 = uStack_34 << 6;
  begin._7_1_ = 0;
  end = StringRef::begin((StringRef *)&this_local);
  dot = StringRef::end((StringRef *)&this_local);
  pcVar4 = skipLeadingZeroesAndAnyDot(end,dot,&p);
  firstSignificantDigit = pcVar4;
  while (firstSignificantDigit != dot) {
    if (*firstSignificantDigit == '.') {
      if (p != dot) {
        __assert_fail("dot == end && \"String contains multiple dots\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x8f6,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                     );
      }
      p = firstSignificantDigit;
      firstSignificantDigit = firstSignificantDigit + 1;
    }
    else {
      digitValue = hexDigitValue(*firstSignificantDigit);
      if ((ulong)digitValue == 0xffffffff) break;
      firstSignificantDigit = firstSignificantDigit + 1;
      if (local_38 == 0) {
        if ((begin._7_1_ & 1) == 0) {
          significand._0_4_ = trailingHexadecimalFraction(firstSignificantDigit,dot,digitValue);
          begin._7_1_ = 1;
        }
      }
      else {
        local_38 = local_38 - 4;
        _bitPos[local_38 >> 6] =
             (ulong)digitValue << ((byte)local_38 & 0x3f) | _bitPos[local_38 >> 6];
      }
    }
  }
  if (firstSignificantDigit == dot) {
    __assert_fail("p != end && \"Hex strings require an exponent\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x90d,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if ((*firstSignificantDigit == 'p') || (bVar1 = false, *firstSignificantDigit == 'P')) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("(*p == \'p\' || *p == \'P\') && \"Invalid character in significand\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x90e,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if (firstSignificantDigit == end) {
    __assert_fail("p != begin && \"Significand has no digits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x90f,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if ((p == dot) || (bVar1 = false, (long)firstSignificantDigit - (long)end != 1)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("(dot == end || p - begin != 1) && \"Significand has no digits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x910,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if (firstSignificantDigit != pcVar4) {
    if (p == dot) {
      p = firstSignificantDigit;
    }
    local_74 = (int)p - (int)pcVar4;
    if (local_74 < 0) {
      local_74 = local_74 + 1;
    }
    iVar2 = totalExponent(firstSignificantDigit + 1,dot,
                          this->semantics->precision + local_74 * 4 + -1 + uStack_34 * -0x40);
    this->exponent = (ExponentType)iVar2;
  }
  oVar3 = normalize(this,significand._4_4_,(lostFraction)significand);
  return oVar3;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromHexadecimalString(StringRef s,
                                        roundingMode rounding_mode) {
  lostFraction lost_fraction = lfExactlyZero;

  category = fcNormal;
  zeroSignificand();
  exponent = 0;

  integerPart *significand = significandParts();
  unsigned partsCount = partCount();
  unsigned bitPos = partsCount * integerPartWidth;
  bool computedTrailingFraction = false;

  // Skip leading zeroes and any (hexa)decimal point.
  StringRef::iterator begin = s.begin();
  StringRef::iterator end = s.end();
  StringRef::iterator dot;
  StringRef::iterator p = skipLeadingZeroesAndAnyDot(begin, end, &dot);
  StringRef::iterator firstSignificantDigit = p;

  while (p != end) {
    integerPart hex_value;

    if (*p == '.') {
      assert(dot == end && "String contains multiple dots");
      dot = p++;
      continue;
    }

    hex_value = hexDigitValue(*p);
    if (hex_value == -1U)
      break;

    p++;

    // Store the number while we have space.
    if (bitPos) {
      bitPos -= 4;
      hex_value <<= bitPos % integerPartWidth;
      significand[bitPos / integerPartWidth] |= hex_value;
    } else if (!computedTrailingFraction) {
      lost_fraction = trailingHexadecimalFraction(p, end, hex_value);
      computedTrailingFraction = true;
    }
  }

  /* Hex floats require an exponent but not a hexadecimal point.  */
  assert(p != end && "Hex strings require an exponent");
  assert((*p == 'p' || *p == 'P') && "Invalid character in significand");
  assert(p != begin && "Significand has no digits");
  assert((dot == end || p - begin != 1) && "Significand has no digits");

  /* Ignore the exponent if we are zero.  */
  if (p != firstSignificantDigit) {
    int expAdjustment;

    /* Implicit hexadecimal point?  */
    if (dot == end)
      dot = p;

    /* Calculate the exponent adjustment implicit in the number of
       significant digits.  */
    expAdjustment = static_cast<int>(dot - firstSignificantDigit);
    if (expAdjustment < 0)
      expAdjustment++;
    expAdjustment = expAdjustment * 4 - 1;

    /* Adjust for writing the significand starting at the most
       significant nibble.  */
    expAdjustment += semantics->precision;
    expAdjustment -= partsCount * integerPartWidth;

    /* Adjust for the given exponent.  */
    exponent = totalExponent(p + 1, end, expAdjustment);
  }

  return normalize(rounding_mode, lost_fraction);
}